

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port,
                          _Bool blocking)

{
  long *plVar1;
  char cVar2;
  curl_socket_t readfd0;
  SessionHandle *data;
  bool bVar3;
  _Bool _Var4;
  CURLcode CVar5;
  int iVar6;
  int iVar7;
  CHUNKcode CVar8;
  Curl_send_buffer *buff;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  undefined8 extraout_RAX;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  byte bVar16;
  uint uVar17;
  undefined7 in_register_00000081;
  int iVar18;
  char *pcVar19;
  bool bVar20;
  CURLcode local_d0;
  size_t local_b8;
  char *local_a8;
  long local_98;
  ssize_t gotbytes;
  char *local_88;
  uint local_7c;
  ulong local_78;
  connectdata *local_70;
  int local_64;
  undefined4 local_60;
  int subversion;
  ulong local_58;
  char *local_50;
  ssize_t tookcareof;
  int *local_40;
  long *local_38;
  
  local_60 = (undefined4)CONCAT71(in_register_00000081,blocking);
  subversion = 0;
  if (conn->tunnel_state[sockindex] != TUNNEL_COMPLETE) {
    data = conn->data;
    readfd0 = conn->sock[sockindex];
    (conn->bits).proxy_connect_closed = false;
    local_38 = &(data->info).request_size;
    local_88 = (data->state).buffer;
    local_40 = &(data->req).httpcode;
    iVar18 = 0;
    local_58 = 0;
    bVar3 = false;
    local_98 = 0;
    local_7c = remote_port;
    local_64 = sockindex;
    local_50 = hostname;
    do {
      pcVar9 = local_50;
      uVar17 = local_7c;
      if (conn->tunnel_state[sockindex] == TUNNEL_INIT) {
        Curl_infof(data,"Establish HTTP proxy tunnel to %s:%hu\n",local_50);
        (*Curl_cfree)((data->req).newurl);
        (data->req).newurl = (char *)0x0;
        buff = Curl_add_buffer_init();
        CVar5 = CURLE_OUT_OF_MEMORY;
        if (buff == (Curl_send_buffer *)0x0) {
LAB_004a1c1d:
          local_d0 = CVar5;
          bVar20 = false;
        }
        else {
          pcVar9 = curl_maprintf("%s:%hu",pcVar9,(ulong)uVar17);
          if (pcVar9 == (char *)0x0) {
            Curl_add_buffer_free(buff);
            local_d0 = CURLE_OUT_OF_MEMORY;
LAB_004a1c44:
            bVar20 = false;
          }
          else {
            CVar5 = Curl_http_output_auth(conn,"CONNECT",pcVar9,true);
            (*Curl_cfree)(pcVar9);
            if (CVar5 == CURLE_OK) {
              pcVar9 = "1.1";
              if (conn->proxytype == CURLPROXY_HTTP_1_0) {
                pcVar9 = "1.0";
              }
              bVar20 = (conn->bits).ipv6_ip != false;
              pcVar12 = "";
              if (bVar20) {
                pcVar12 = "[";
              }
              pcVar14 = "";
              if (bVar20) {
                pcVar14 = "]";
              }
              pcVar12 = curl_maprintf("%s%s%s:%hu",pcVar12,local_50,pcVar14,(ulong)local_7c);
              if (pcVar12 == (char *)0x0) {
LAB_004a1bed:
                Curl_add_buffer_free(buff);
                local_d0 = CURLE_OUT_OF_MEMORY;
                bVar20 = false;
                CVar5 = CURLE_OK;
              }
              else {
                pcVar14 = Curl_checkProxyheaders(conn,"Host:");
                pcVar15 = "";
                if ((pcVar14 == (char *)0x0) &&
                   (pcVar15 = curl_maprintf("Host: %s\r\n"), pcVar15 == (char *)0x0)) {
                  (*Curl_cfree)(pcVar12);
                  goto LAB_004a1bed;
                }
                pcVar14 = Curl_checkProxyheaders(conn,"Proxy-Connection:");
                pcVar19 = "";
                if (pcVar14 == (char *)0x0) {
                  pcVar19 = "Proxy-Connection: Keep-Alive\r\n";
                }
                pcVar10 = Curl_checkProxyheaders(conn,"User-Agent:");
                pcVar14 = "";
                if ((pcVar10 == (char *)0x0) && (pcVar14 = "", (data->set).str[0x19] != (char *)0x0)
                   ) {
                  pcVar14 = (conn->allocptr).uagent;
                }
                pcVar10 = (conn->allocptr).proxyuserpwd;
                if (pcVar10 == (char *)0x0) {
                  pcVar10 = "";
                }
                CVar5 = Curl_add_bufferf(buff,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar12,pcVar9,
                                         pcVar15,pcVar10,pcVar14,pcVar19);
                if (*pcVar15 != '\0') {
                  (*Curl_cfree)(pcVar15);
                }
                (*Curl_cfree)(pcVar12);
                if (CVar5 == CURLE_OK) {
                  CVar5 = Curl_add_custom_headers(conn,true,buff);
                }
                if (CVar5 == CURLE_OK) {
                  CVar5 = Curl_add_bufferf(buff,"\r\n");
                }
                if (CVar5 == CURLE_OK) {
                  CVar5 = Curl_add_buffer_send(buff,conn,local_38,0,local_64);
                }
                bVar20 = true;
                if (CVar5 != CURLE_OK) {
                  Curl_failf(data,"Failed sending CONNECT to proxy");
                }
                buff = (Curl_send_buffer *)0x0;
              }
              if (!bVar20) goto LAB_004a1c44;
            }
            Curl_add_buffer_free(buff);
            if (CVar5 != CURLE_OK) goto LAB_004a1c1d;
            conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
            bVar20 = true;
          }
        }
        if (!bVar20) {
          return local_d0;
        }
      }
      lVar11 = Curl_timeleft(data,(timeval *)0x0,true);
      if (lVar11 < 1) {
        Curl_failf(data,"Proxy CONNECT aborted due to timeout");
        return CURLE_RECV_ERROR;
      }
      if (((char)local_60 == '\0') && (iVar6 = Curl_socket_check(readfd0,-1,-1,0), iVar6 == 0)) {
        return CURLE_OK;
      }
      bVar16 = 1;
      uVar13 = 0;
      local_b8 = 0;
      local_a8 = local_88;
      pcVar9 = local_88;
      do {
        if (((0x3fff < uVar13) || (bVar16 == 0)) || (iVar18 != 0)) {
LAB_004a23c4:
          uVar17 = 1;
          if (iVar18 != 0) {
            local_d0 = CURLE_RECV_ERROR;
            goto LAB_004a2457;
          }
          if ((data->info).httpproxycode != 200) {
            CVar5 = Curl_http_auth_act(conn);
            if (CVar5 != CURLE_OK) {
              iVar18 = 0;
              local_d0 = CVar5;
              goto LAB_004a23f7;
            }
            if ((conn->bits).close != false) {
              bVar3 = true;
            }
          }
          iVar18 = 0;
          if ((bVar3) && ((data->req).newurl != (char *)0x0)) {
            Curl_closesocket(conn,conn->sock[sockindex]);
            conn->sock[sockindex] = -1;
            uVar17 = 2;
          }
          else {
            uVar17 = 0;
          }
          goto LAB_004a2457;
        }
        do {
          lVar11 = Curl_timeleft(data,(timeval *)0x0,true);
          if (lVar11 < 1) {
            Curl_failf(data,"Proxy CONNECT aborted due to timeout");
            iVar18 = 2;
            goto LAB_004a23c4;
          }
          if (999 < lVar11) {
            lVar11 = 1000;
          }
          iVar6 = Curl_socket_check(readfd0,-1,-1,lVar11);
          if (iVar6 == 0) goto LAB_004a2393;
          if (iVar6 == -1) {
            pcVar12 = "Proxy CONNECT aborted due to select/poll error";
            goto LAB_004a1dae;
          }
          CVar5 = Curl_read(conn,readfd0,pcVar9,0x4000 - uVar13,&gotbytes);
        } while (CVar5 == CURLE_AGAIN);
        if (CVar5 == CURLE_OK) {
          if (gotbytes < 1) {
            if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
              bVar16 = 0;
              pcVar12 = "Proxy CONNECT aborted";
LAB_004a1dae:
              Curl_failf(data,pcVar12);
              iVar18 = 1;
            }
            else {
              (conn->bits).proxy_connect_closed = true;
              bVar16 = 0;
              Curl_infof(data,"Proxy CONNECT connection closed\n");
            }
          }
          else {
            if (bVar16 < 2) {
              if (gotbytes < 1) {
                uVar17 = 0;
                uVar13 = gotbytes + uVar13;
              }
              else {
                lVar11 = 0;
                iVar6 = 0;
                local_78 = gotbytes + uVar13;
                local_70 = conn;
                do {
                  local_b8 = (long)(int)local_b8 + 1;
                  if (*pcVar9 == '\n') {
                    if ((data->set).verbose == true) {
                      Curl_debug(data,CURLINFO_HEADER_IN,local_a8,(long)(int)local_b8,conn);
                    }
                    CVar5 = Curl_client_write(conn,(data->set).include_header | 2,local_a8,local_b8)
                    ;
                    conn = local_70;
                    plVar1 = &(data->info).header_size;
                    *plVar1 = *plVar1 + local_b8;
                    plVar1 = &(data->req).headerbytecount;
                    *plVar1 = *plVar1 + local_b8;
                    uVar17 = 1;
                    if (CVar5 == CURLE_OK) {
                      if ((*local_a8 == '\r') || (*local_a8 == '\n')) {
                        if (((data->req).httpcode == 0x197) && ((data->state).authproblem == false))
                        {
                          if (local_98 == 0) {
                            if ((local_58 & 1) == 0) {
                              bVar16 = 0;
                              local_98 = 0;
                            }
                            else {
                              (data->req).ignorebody = true;
                              Curl_infof(data,"%zd bytes of chunk left\n",gotbytes - lVar11);
                              pcVar9 = local_a8 + 1;
                              if (*pcVar9 == '\n') {
                                local_a8 = local_a8 + 1;
                              }
                              iVar6 = iVar6 + (uint)(*pcVar9 == '\n');
                              CVar8 = Curl_httpchunk_read(conn,local_a8 + 1,gotbytes - iVar6,
                                                          &gotbytes);
                              if (CVar8 == CHUNKE_STOP) {
                                bVar16 = 0;
                                Curl_infof(data,"chunk reading DONE\n");
                                conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                              }
                              else {
                                Curl_infof(data,"Read %zd bytes of chunk, continue\n",gotbytes);
                                bVar16 = 2;
                              }
                              local_98 = 0;
                            }
                          }
                          else {
                            Curl_infof(data,"Ignore %ld bytes of response-body\n",local_98);
                            local_98 = local_98 + (lVar11 - gotbytes);
                            bVar16 = (0 < local_98) * '\x02';
                          }
                        }
                        else {
                          if (((data->info).httpproxycode == 200) && (gotbytes != iVar6 + 1)) {
                            Curl_failf(data,
                                       "Proxy CONNECT followed by %zd bytes of opaque data. Data ignored (known bug #39)"
                                      );
                          }
                          bVar16 = 0;
                        }
                        conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                        uVar17 = 0xb;
                        local_78 = 0;
                        pcVar9 = local_88;
                        CVar5 = local_d0;
                      }
                      else {
                        cVar2 = local_a8[local_b8];
                        local_a8[local_b8] = '\0';
                        iVar7 = Curl_raw_nequal("WWW-Authenticate:",local_a8,0x11);
                        conn = local_70;
                        if (((iVar7 == 0) || ((data->req).httpcode != 0x191)) &&
                           ((iVar7 = Curl_raw_nequal("Proxy-authenticate:",local_a8,0x13),
                            iVar7 == 0 || ((data->req).httpcode != 0x197)))) {
                          iVar7 = Curl_raw_nequal("Content-Length:",local_a8,0xf);
                          if (iVar7 == 0) {
                            _Var4 = Curl_compareheader(local_a8,"Connection:","close");
                            if (_Var4) {
LAB_004a217f:
                              bVar3 = true;
                            }
                            else {
                              _Var4 = Curl_compareheader(local_a8,"Transfer-Encoding:","chunked");
                              if (_Var4) {
                                Curl_infof(data,"CONNECT responded chunked\n");
                                Curl_httpchunk_init(conn);
                                local_58 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                              }
                              else {
                                _Var4 = Curl_compareheader(local_a8,"Proxy-Connection:","close");
                                if (_Var4) goto LAB_004a217f;
                                iVar7 = __isoc99_sscanf(local_a8,"HTTP/1.%d %d",&subversion,local_40
                                                       );
                                if (iVar7 == 2) {
                                  (data->info).httpproxycode = (data->req).httpcode;
                                }
                              }
                            }
                          }
                          else {
                            local_98 = strtol(local_a8 + 0xf,(char **)0x0,10);
                          }
                        }
                        else {
                          iVar7 = (data->req).httpcode;
                          pcVar12 = Curl_copy_header_value(local_a8);
                          if (pcVar12 == (char *)0x0) {
                            local_d0 = CURLE_OUT_OF_MEMORY;
                            bVar20 = false;
                          }
                          else {
                            CVar5 = Curl_http_input_auth(conn,iVar7 == 0x197,pcVar12);
                            (*Curl_cfree)(pcVar12);
                            bVar20 = CVar5 == CURLE_OK;
                            if (!bVar20) {
                              local_d0 = CVar5;
                            }
                          }
                          uVar17 = 1;
                          CVar5 = local_d0;
                          if (!bVar20) goto LAB_004a2221;
                        }
                        local_a8[local_b8] = cVar2;
                        local_a8 = pcVar9 + 1;
                        uVar17 = 0;
                        local_b8 = 0;
                        CVar5 = local_d0;
                      }
                    }
LAB_004a2221:
                    local_d0 = CVar5;
                    if (uVar17 != 0) {
                      uVar13 = local_78;
                      if (uVar17 != 0xb) goto LAB_004a2387;
                      break;
                    }
                  }
                  pcVar9 = pcVar9 + 1;
                  iVar6 = iVar6 + 1;
                  lVar11 = (long)iVar6;
                } while (lVar11 < gotbytes);
                uVar17 = 0;
                uVar13 = local_78;
              }
            }
            else if (local_98 == 0) {
              tookcareof = 0;
              CVar8 = Curl_httpchunk_read(conn,local_88,gotbytes,&tookcareof);
              if (CVar8 == CHUNKE_STOP) {
                bVar16 = 0;
                Curl_infof(data,"chunk reading DONE\n");
                conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
              }
              else {
                Curl_infof(data,"Read %zd bytes of chunk, continue\n",tookcareof);
              }
              uVar17 = 0;
              local_98 = 0;
              uVar13 = 0;
              pcVar9 = local_88;
            }
            else {
              lVar11 = local_98 - gotbytes;
              if (lVar11 == 0 || local_98 < gotbytes) {
                bVar16 = 0;
              }
              uVar17 = (uint)(lVar11 < 1) << 3;
              uVar13 = 0;
              pcVar9 = local_88;
              local_98 = lVar11;
            }
LAB_004a2387:
            if ((uVar17 & 7) != 0) goto LAB_004a2457;
          }
        }
        else {
          bVar16 = 0;
        }
LAB_004a2393:
        iVar6 = Curl_pgrsUpdate(conn);
      } while (iVar6 == 0);
      local_d0 = CURLE_ABORTED_BY_CALLBACK;
LAB_004a23f7:
      uVar17 = 1;
LAB_004a2457:
      if (uVar17 != 0) {
        if (uVar17 != 2) {
          return local_d0;
        }
        break;
      }
      if (((data->req).newurl != (char *)0x0) && (conn->tunnel_state[sockindex] == TUNNEL_COMPLETE))
      {
        conn->tunnel_state[sockindex] = TUNNEL_INIT;
        Curl_infof(data,"TUNNEL_STATE switched to: %d\n",0);
      }
    } while ((data->req).newurl != (char *)0x0);
    if ((data->req).httpcode == 200) {
      conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
      (*Curl_cfree)((conn->allocptr).proxyuserpwd);
      (conn->allocptr).proxyuserpwd = (char *)0x0;
      (data->state).authproxy.done = true;
      Curl_infof(data,"Proxy replied OK to CONNECT request\n");
      (data->req).ignorebody = false;
      (conn->bits).rewindaftersend = false;
      return CURLE_OK;
    }
    if ((bVar3) && ((data->req).newurl != (char *)0x0)) {
      (conn->bits).proxy_connect_closed = true;
      Curl_infof(data,"Connect me again please\n");
    }
    else {
      (*Curl_cfree)((data->req).newurl);
      (data->req).newurl = (char *)0x0;
      (conn->bits).close = true;
      Curl_closesocket(conn,conn->sock[sockindex]);
      conn->sock[sockindex] = -1;
    }
    conn->tunnel_state[sockindex] = TUNNEL_INIT;
    if ((conn->bits).proxy_connect_closed == false) {
      Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                 (ulong)(uint)(data->req).httpcode);
      return CURLE_RECV_ERROR;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port,
                           bool blocking)
{
  int subversion=0;
  struct SessionHandle *data=conn->data;
  struct SingleRequest *k = &data->req;
  CURLcode result;
  curl_socket_t tunnelsocket = conn->sock[sockindex];
  curl_off_t cl=0;
  bool closeConnection = FALSE;
  bool chunked_encoding = FALSE;
  long check;

#define SELECT_OK      0
#define SELECT_ERROR   1
#define SELECT_TIMEOUT 2
  int error = SELECT_OK;

  if(conn->tunnel_state[sockindex] == TUNNEL_COMPLETE)
    return CURLE_OK; /* CONNECT is already completed */

  conn->bits.proxy_connect_closed = FALSE;

  do {
    if(TUNNEL_INIT == conn->tunnel_state[sockindex]) {
      /* BEGIN CONNECT PHASE */
      char *host_port;
      Curl_send_buffer *req_buffer;

      infof(data, "Establish HTTP proxy tunnel to %s:%hu\n",
            hostname, remote_port);

        /* This only happens if we've looped here due to authentication
           reasons, and we don't really use the newly cloned URL here
           then. Just free() it. */
      free(data->req.newurl);
      data->req.newurl = NULL;

      /* initialize a dynamic send-buffer */
      req_buffer = Curl_add_buffer_init();

      if(!req_buffer)
        return CURLE_OUT_OF_MEMORY;

      host_port = aprintf("%s:%hu", hostname, remote_port);
      if(!host_port) {
        Curl_add_buffer_free(req_buffer);
        return CURLE_OUT_OF_MEMORY;
      }

      /* Setup the proxy-authorization header, if any */
      result = Curl_http_output_auth(conn, "CONNECT", host_port, TRUE);

      free(host_port);

      if(!result) {
        char *host=(char *)"";
        const char *proxyconn="";
        const char *useragent="";
        const char *http = (conn->proxytype == CURLPROXY_HTTP_1_0) ?
          "1.0" : "1.1";
        char *hostheader= /* host:port with IPv6 support */
          aprintf("%s%s%s:%hu", conn->bits.ipv6_ip?"[":"",
                  hostname, conn->bits.ipv6_ip?"]":"",
                  remote_port);
        if(!hostheader) {
          Curl_add_buffer_free(req_buffer);
          return CURLE_OUT_OF_MEMORY;
        }

        if(!Curl_checkProxyheaders(conn, "Host:")) {
          host = aprintf("Host: %s\r\n", hostheader);
          if(!host) {
            free(hostheader);
            Curl_add_buffer_free(req_buffer);
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if(!Curl_checkProxyheaders(conn, "Proxy-Connection:"))
          proxyconn = "Proxy-Connection: Keep-Alive\r\n";

        if(!Curl_checkProxyheaders(conn, "User-Agent:") &&
           data->set.str[STRING_USERAGENT])
          useragent = conn->allocptr.uagent;

        result =
          Curl_add_bufferf(req_buffer,
                           "CONNECT %s HTTP/%s\r\n"
                           "%s"  /* Host: */
                           "%s"  /* Proxy-Authorization */
                           "%s"  /* User-Agent */
                           "%s", /* Proxy-Connection */
                           hostheader,
                           http,
                           host,
                           conn->allocptr.proxyuserpwd?
                           conn->allocptr.proxyuserpwd:"",
                           useragent,
                           proxyconn);

        if(host && *host)
          free(host);
        free(hostheader);

        if(!result)
          result = Curl_add_custom_headers(conn, TRUE, req_buffer);

        if(!result)
          /* CRLF terminate the request */
          result = Curl_add_bufferf(req_buffer, "\r\n");

        if(!result) {
          /* Send the connect request to the proxy */
          /* BLOCKING */
          result =
            Curl_add_buffer_send(req_buffer, conn,
                                 &data->info.request_size, 0, sockindex);
        }
        req_buffer = NULL;
        if(result)
          failf(data, "Failed sending CONNECT to proxy");
      }

      Curl_add_buffer_free(req_buffer);
      if(result)
        return result;

      conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
    } /* END CONNECT PHASE */

    check = Curl_timeleft(data, NULL, TRUE);
    if(check <= 0) {
      failf(data, "Proxy CONNECT aborted due to timeout");
      return CURLE_RECV_ERROR;
    }

    if(!blocking) {
      if(0 == Curl_socket_ready(tunnelsocket, CURL_SOCKET_BAD, 0))
        /* return so we'll be called again polling-style */
        return CURLE_OK;
      else {
        DEBUGF(infof(data,
               "Read response immediately from proxy CONNECT\n"));
      }
    }

    /* at this point, the tunnel_connecting phase is over. */

    { /* READING RESPONSE PHASE */
      size_t nread;   /* total size read */
      int perline; /* count bytes per line */
      int keepon=TRUE;
      ssize_t gotbytes;
      char *ptr;
      char *line_start;

      ptr=data->state.buffer;
      line_start = ptr;

      nread=0;
      perline=0;

      while((nread<BUFSIZE) && (keepon && !error)) {

        check = Curl_timeleft(data, NULL, TRUE);
        if(check <= 0) {
          failf(data, "Proxy CONNECT aborted due to timeout");
          error = SELECT_TIMEOUT; /* already too little time */
          break;
        }

        /* loop every second at least, less if the timeout is near */
        switch (Curl_socket_ready(tunnelsocket, CURL_SOCKET_BAD,
                                  check<1000L?check:1000)) {
        case -1: /* select() error, stop reading */
          error = SELECT_ERROR;
          failf(data, "Proxy CONNECT aborted due to select/poll error");
          break;
        case 0: /* timeout */
          break;
        default:
          DEBUGASSERT(ptr+BUFSIZE-nread <= data->state.buffer+BUFSIZE+1);
          result = Curl_read(conn, tunnelsocket, ptr, BUFSIZE-nread,
                             &gotbytes);
          if(result==CURLE_AGAIN)
            continue; /* go loop yourself */
          else if(result)
            keepon = FALSE;
          else if(gotbytes <= 0) {
            keepon = FALSE;
            if(data->set.proxyauth && data->state.authproxy.avail) {
              /* proxy auth was requested and there was proxy auth available,
                 then deem this as "mere" proxy disconnect */
              conn->bits.proxy_connect_closed = TRUE;
              infof(data, "Proxy CONNECT connection closed\n");
            }
            else {
              error = SELECT_ERROR;
              failf(data, "Proxy CONNECT aborted");
            }
          }
          else {
            /*
             * We got a whole chunk of data, which can be anything from one
             * byte to a set of lines and possibly just a piece of the last
             * line.
             */
            int i;

            nread += gotbytes;

            if(keepon > TRUE) {
              /* This means we are currently ignoring a response-body */

              nread = 0; /* make next read start over in the read buffer */
              ptr=data->state.buffer;
              if(cl) {
                /* A Content-Length based body: simply count down the counter
                   and make sure to break out of the loop when we're done! */
                cl -= gotbytes;
                if(cl<=0) {
                  keepon = FALSE;
                  break;
                }
              }
              else {
                /* chunked-encoded body, so we need to do the chunked dance
                   properly to know when the end of the body is reached */
                CHUNKcode r;
                ssize_t tookcareof=0;

                /* now parse the chunked piece of data so that we can
                   properly tell when the stream ends */
                r = Curl_httpchunk_read(conn, ptr, gotbytes, &tookcareof);
                if(r == CHUNKE_STOP) {
                  /* we're done reading chunks! */
                  infof(data, "chunk reading DONE\n");
                  keepon = FALSE;
                  /* we did the full CONNECT treatment, go COMPLETE */
                  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                }
                else
                  infof(data, "Read %zd bytes of chunk, continue\n",
                        tookcareof);
              }
            }
            else
              for(i = 0; i < gotbytes; ptr++, i++) {
                perline++; /* amount of bytes in this line so far */
                if(*ptr == 0x0a) {
                  char letter;
                  int writetype;

                  /* convert from the network encoding */
                  result = Curl_convert_from_network(data, line_start,
                                                     perline);
                  /* Curl_convert_from_network calls failf if unsuccessful */
                  if(result)
                    return result;

                  /* output debug if that is requested */
                  if(data->set.verbose)
                    Curl_debug(data, CURLINFO_HEADER_IN,
                               line_start, (size_t)perline, conn);

                  /* send the header to the callback */
                  writetype = CLIENTWRITE_HEADER;
                  if(data->set.include_header)
                    writetype |= CLIENTWRITE_BODY;

                  result = Curl_client_write(conn, writetype, line_start,
                                             perline);

                  data->info.header_size += (long)perline;
                  data->req.headerbytecount += (long)perline;

                  if(result)
                    return result;

                  /* Newlines are CRLF, so the CR is ignored as the line isn't
                     really terminated until the LF comes. Treat a following CR
                     as end-of-headers as well.*/

                  if(('\r' == line_start[0]) ||
                     ('\n' == line_start[0])) {
                    /* end of response-headers from the proxy */
                    nread = 0; /* make next read start over in the read
                                  buffer */
                    ptr=data->state.buffer;
                    if((407 == k->httpcode) && !data->state.authproblem) {
                      /* If we get a 407 response code with content length
                         when we have no auth problem, we must ignore the
                         whole response-body */
                      keepon = 2;

                      if(cl) {
                        infof(data, "Ignore %" CURL_FORMAT_CURL_OFF_T
                              " bytes of response-body\n", cl);

                        /* remove the remaining chunk of what we already
                           read */
                        cl -= (gotbytes - i);

                        if(cl<=0)
                          /* if the whole thing was already read, we are done!
                           */
                          keepon=FALSE;
                      }
                      else if(chunked_encoding) {
                        CHUNKcode r;
                        /* We set ignorebody true here since the chunked
                           decoder function will acknowledge that. Pay
                           attention so that this is cleared again when this
                           function returns! */
                        k->ignorebody = TRUE;
                        infof(data, "%zd bytes of chunk left\n", gotbytes-i);

                        if(line_start[1] == '\n') {
                          /* this can only be a LF if the letter at index 0
                             was a CR */
                          line_start++;
                          i++;
                        }

                        /* now parse the chunked piece of data so that we can
                           properly tell when the stream ends */
                        r = Curl_httpchunk_read(conn, line_start+1,
                                                  gotbytes -i, &gotbytes);
                        if(r == CHUNKE_STOP) {
                          /* we're done reading chunks! */
                          infof(data, "chunk reading DONE\n");
                          keepon = FALSE;
                          /* we did the full CONNECT treatment, go to
                             COMPLETE */
                          conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                        }
                        else
                          infof(data, "Read %zd bytes of chunk, continue\n",
                                gotbytes);
                      }
                      else {
                        /* without content-length or chunked encoding, we
                           can't keep the connection alive since the close is
                           the end signal so we bail out at once instead */
                        keepon=FALSE;
                      }
                    }
                    else {
                      keepon = FALSE;
                      if(200 == data->info.httpproxycode) {
                        if(gotbytes - (i+1))
                          failf(data, "Proxy CONNECT followed by %zd bytes "
                                "of opaque data. Data ignored (known bug #39)",
                                gotbytes - (i+1));
                      }
                    }
                    /* we did the full CONNECT treatment, go to COMPLETE */
                    conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                    break; /* breaks out of for-loop, not switch() */
                  }

                  /* keep a backup of the position we are about to blank */
                  letter = line_start[perline];
                  line_start[perline]=0; /* zero terminate the buffer */
                  if((checkprefix("WWW-Authenticate:", line_start) &&
                      (401 == k->httpcode)) ||
                     (checkprefix("Proxy-authenticate:", line_start) &&
                      (407 == k->httpcode))) {

                    bool proxy = (k->httpcode == 407) ? TRUE : FALSE;
                    char *auth = Curl_copy_header_value(line_start);
                    if(!auth)
                      return CURLE_OUT_OF_MEMORY;

                    result = Curl_http_input_auth(conn, proxy, auth);

                    free(auth);

                    if(result)
                      return result;
                  }
                  else if(checkprefix("Content-Length:", line_start)) {
                    cl = curlx_strtoofft(line_start +
                                         strlen("Content-Length:"), NULL, 10);
                  }
                  else if(Curl_compareheader(line_start,
                                             "Connection:", "close"))
                    closeConnection = TRUE;
                  else if(Curl_compareheader(line_start,
                                             "Transfer-Encoding:",
                                             "chunked")) {
                    infof(data, "CONNECT responded chunked\n");
                    chunked_encoding = TRUE;
                    /* init our chunky engine */
                    Curl_httpchunk_init(conn);
                  }
                  else if(Curl_compareheader(line_start,
                                             "Proxy-Connection:", "close"))
                    closeConnection = TRUE;
                  else if(2 == sscanf(line_start, "HTTP/1.%d %d",
                                      &subversion,
                                      &k->httpcode)) {
                    /* store the HTTP code from the proxy */
                    data->info.httpproxycode = k->httpcode;
                  }
                  /* put back the letter we blanked out before */
                  line_start[perline]= letter;

                  perline=0; /* line starts over here */
                  line_start = ptr+1; /* this skips the zero byte we wrote */
                }
              }
          }
          break;
        } /* switch */
        if(Curl_pgrsUpdate(conn))
          return CURLE_ABORTED_BY_CALLBACK;
      } /* while there's buffer left and loop is requested */

      if(error)
        return CURLE_RECV_ERROR;

      if(data->info.httpproxycode != 200) {
        /* Deal with the possibly already received authenticate
           headers. 'newurl' is set to a new URL if we must loop. */
        result = Curl_http_auth_act(conn);
        if(result)
          return result;

        if(conn->bits.close)
          /* the connection has been marked for closure, most likely in the
             Curl_http_auth_act() function and thus we can kill it at once
             below
          */
          closeConnection = TRUE;
      }

      if(closeConnection && data->req.newurl) {
        /* Connection closed by server. Don't use it anymore */
        Curl_closesocket(conn, conn->sock[sockindex]);
        conn->sock[sockindex] = CURL_SOCKET_BAD;
        break;
      }
    } /* END READING RESPONSE PHASE */

    /* If we are supposed to continue and request a new URL, which basically
     * means the HTTP authentication is still going on so if the tunnel
     * is complete we start over in INIT state */
    if(data->req.newurl &&
       (TUNNEL_COMPLETE == conn->tunnel_state[sockindex])) {
      conn->tunnel_state[sockindex] = TUNNEL_INIT;
      infof(data, "TUNNEL_STATE switched to: %d\n",
            conn->tunnel_state[sockindex]);
    }

  } while(data->req.newurl);

  if(200 != data->req.httpcode) {
    if(closeConnection && data->req.newurl) {
      conn->bits.proxy_connect_closed = TRUE;
      infof(data, "Connect me again please\n");
    }
    else {
      free(data->req.newurl);
      data->req.newurl = NULL;
      /* failure, close this connection to avoid re-use */
      connclose(conn, "proxy CONNECT failure");
      Curl_closesocket(conn, conn->sock[sockindex]);
      conn->sock[sockindex] = CURL_SOCKET_BAD;
    }

    /* to back to init state */
    conn->tunnel_state[sockindex] = TUNNEL_INIT;

    if(conn->bits.proxy_connect_closed)
      /* this is not an error, just part of the connection negotiation */
      return CURLE_OK;
    else {
      failf(data, "Received HTTP code %d from proxy after CONNECT",
            data->req.httpcode);
      return CURLE_RECV_ERROR;
    }
  }

  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;

  /* If a proxy-authorization header was used for the proxy, then we should
     make sure that it isn't accidentally used for the document request
     after we've connected. So let's free and clear it here. */
  Curl_safefree(conn->allocptr.proxyuserpwd);
  conn->allocptr.proxyuserpwd = NULL;

  data->state.authproxy.done = TRUE;

  infof (data, "Proxy replied OK to CONNECT request\n");
  data->req.ignorebody = FALSE; /* put it (back) to non-ignore state */
  conn->bits.rewindaftersend = FALSE; /* make sure this isn't set for the
                                         document request  */
  return CURLE_OK;
}